

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HostCoordinator.hpp
# Opt level: O0

void __thiscall
memory::HostCoordinator<float,memory::Allocator<float,memory::impl::AlignedPolicy<32ul>>>::
copy<memory::Allocator<float,memory::impl::AlignedPolicy<16ul>>,memory::Allocator<float,memory::impl::AlignedPolicy<32ul>>>
          (HostCoordinator<float,memory::Allocator<float,memory::impl::AlignedPolicy<32ul>>> *this,
          ArrayView<value_type,_HostCoordinator<value_type,_Allocator<float,_AlignedPolicy<16UL>_>_>_>
          *from,ArrayView<value_type,_HostCoordinator<value_type,_Allocator<float,_AlignedPolicy<32UL>_>_>_>
                *to)

{
  bool bVar1;
  size_type sVar2;
  size_type sVar3;
  const_pointer __first;
  const_pointer __last;
  pointer __result;
  ArrayView<value_type,_HostCoordinator<value_type,_Allocator<float,_AlignedPolicy<32UL>_>_>_>
  *to_local;
  ArrayView<value_type,_HostCoordinator<value_type,_Allocator<float,_AlignedPolicy<16UL>_>_>_>
  *from_local;
  HostCoordinator<float,_memory::Allocator<float,_memory::impl::AlignedPolicy<32UL>_>_> *this_local;
  
  sVar2 = ArrayViewImpl<memory::ArrayReference<float,_memory::HostCoordinator<float,_memory::Allocator<float,_memory::impl::AlignedPolicy<16UL>_>_>_>,_float,_memory::HostCoordinator<float,_memory::Allocator<float,_memory::impl::AlignedPolicy<16UL>_>_>_>
          ::size(from);
  sVar3 = ArrayViewImpl<memory::ArrayReference<float,_memory::HostCoordinator<float,_memory::Allocator<float,_memory::impl::AlignedPolicy<32UL>_>_>_>,_float,_memory::HostCoordinator<float,_memory::Allocator<float,_memory::impl::AlignedPolicy<32UL>_>_>_>
          ::size(to);
  if (sVar2 != sVar3) {
    __assert_fail("from.size()==to.size()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/bcumming[P]vector/include/HostCoordinator.hpp"
                  ,0x65,
                  "void memory::HostCoordinator<float, memory::Allocator<float, memory::impl::AlignedPolicy<32>>>::copy(const ArrayView<value_type, HostCoordinator<value_type, Allocator1>> &, ArrayView<value_type, HostCoordinator<value_type, Allocator2>> &) [T = float, Allocator = memory::Allocator<float, memory::impl::AlignedPolicy<32>>, Allocator1 = memory::Allocator<float, memory::impl::AlignedPolicy<16>>, Allocator2 = memory::Allocator<float, memory::impl::AlignedPolicy<32>>]"
                 );
  }
  bVar1 = ArrayViewImpl<memory::ArrayReference<float,memory::HostCoordinator<float,memory::Allocator<float,memory::impl::AlignedPolicy<16ul>>>>,float,memory::HostCoordinator<float,memory::Allocator<float,memory::impl::AlignedPolicy<16ul>>>>
          ::
          overlaps<memory::ArrayViewImpl<memory::ArrayReference<float,memory::HostCoordinator<float,memory::Allocator<float,memory::impl::AlignedPolicy<32ul>>>>,float,memory::HostCoordinator<float,memory::Allocator<float,memory::impl::AlignedPolicy<32ul>>>>&,std::enable_if<true,void>>
                    ((ArrayViewImpl<memory::ArrayReference<float,memory::HostCoordinator<float,memory::Allocator<float,memory::impl::AlignedPolicy<16ul>>>>,float,memory::HostCoordinator<float,memory::Allocator<float,memory::impl::AlignedPolicy<16ul>>>>
                      *)from,to);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    __assert_fail("!from.overlaps(to)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/bcumming[P]vector/include/HostCoordinator.hpp"
                  ,0x66,
                  "void memory::HostCoordinator<float, memory::Allocator<float, memory::impl::AlignedPolicy<32>>>::copy(const ArrayView<value_type, HostCoordinator<value_type, Allocator1>> &, ArrayView<value_type, HostCoordinator<value_type, Allocator2>> &) [T = float, Allocator = memory::Allocator<float, memory::impl::AlignedPolicy<32>>, Allocator1 = memory::Allocator<float, memory::impl::AlignedPolicy<16>>, Allocator2 = memory::Allocator<float, memory::impl::AlignedPolicy<32>>]"
                 );
  }
  __first = ArrayViewImpl<memory::ArrayReference<float,_memory::HostCoordinator<float,_memory::Allocator<float,_memory::impl::AlignedPolicy<16UL>_>_>_>,_float,_memory::HostCoordinator<float,_memory::Allocator<float,_memory::impl::AlignedPolicy<16UL>_>_>_>
            ::begin(from);
  __last = ArrayViewImpl<memory::ArrayReference<float,_memory::HostCoordinator<float,_memory::Allocator<float,_memory::impl::AlignedPolicy<16UL>_>_>_>,_float,_memory::HostCoordinator<float,_memory::Allocator<float,_memory::impl::AlignedPolicy<16UL>_>_>_>
           ::end(from);
  __result = ArrayViewImpl<memory::ArrayReference<float,_memory::HostCoordinator<float,_memory::Allocator<float,_memory::impl::AlignedPolicy<32UL>_>_>_>,_float,_memory::HostCoordinator<float,_memory::Allocator<float,_memory::impl::AlignedPolicy<32UL>_>_>_>
             ::begin(to);
  std::copy<float_const*,float*>(__first,__last,__result);
  return;
}

Assistant:

void copy(const ArrayView<value_type, HostCoordinator<value_type, Allocator1>>& from,
                    ArrayView<value_type, HostCoordinator<value_type, Allocator2>>& to)
    {
        assert(from.size()==to.size());
        assert(!from.overlaps(to));

        #ifdef VERBOSE
        using c1 = HostCoordinator<value_type, Allocator1>;
        std::cerr << util::type_printer<c1>::print()
                  << "::" + util::blue("copy") << "(" << from.size()
                  << " [" << from.size()*sizeof(value_type) << " bytes])"
                  << " " << from.data() << util::yellow(" -> ") << to.data()
                  << std::endl;
        #endif

        std::copy(from.begin(), from.end(), to.begin());
    }